

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O1

void mstltest2(void)

{
  double **seasonal;
  double *trend;
  double *remainder;
  double *pdVar1;
  long lVar2;
  long lVar3;
  double local_4d8;
  double x [144];
  int s_window;
  int local_3c [2];
  int Nseas;
  int iterate;
  int f [1];
  
  memcpy(&local_4d8,&DAT_00157ff0,0x480);
  local_3c[0] = 1;
  Nseas = 0xc;
  local_3c[1] = 2;
  x[0x8f]._4_4_ = 0xd;
  seasonal = (double **)calloc(1,8);
  trend = (double *)calloc(0x90,8);
  remainder = (double *)calloc(0x90,8);
  pdVar1 = (double *)calloc(0x90,8);
  *seasonal = pdVar1;
  mstl(&local_4d8,0x90,&Nseas,local_3c,(int *)((long)x + 0x47c),(double *)0x0,local_3c + 1,seasonal,
       trend,remainder);
  if (0 < local_3c[0]) {
    lVar3 = 0;
    do {
      printf("\n Seasonal%d :\n",(ulong)(uint)Nseas);
      lVar2 = 0;
      do {
        printf("%g ",seasonal[lVar3][lVar2]);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x90);
      puts("\n");
      lVar3 = lVar3 + 1;
    } while (lVar3 < local_3c[0]);
  }
  mdisplay(trend,1,0x90);
  mdisplay(remainder,1,0x90);
  free(seasonal);
  free(trend);
  free(remainder);
  return;
}

Assistant:

void mstltest2() {
	double x[144] = {112, 118, 132, 129, 121, 135, 148, 148, 136, 119, 104, 118,
        115, 126, 141, 135, 125, 149, 170, 170, 158, 133, 114, 140,
        145, 150, 178, 163, 172, 178, 199, 199, 184, 162, 146, 166,
        171, 180, 193, 181, 183, 218, 230, 242, 209, 191, 172, 194,
        196, 196, 236, 235, 229, 243, 264, 272, 237, 211, 180, 201,
        204, 188, 235, 227, 234, 264, 302, 293, 259, 229, 203, 229,
        242, 233, 267, 269, 270, 315, 364, 347, 312, 274, 237, 278,
        284, 277, 317, 313, 318, 374, 413, 405, 355, 306, 271, 306,
        315, 301, 356, 348, 355, 422, 465, 467, 404, 347, 305, 336,
        340, 318, 362, 348, 363, 435, 491, 505, 404, 359, 310, 337,
        360, 342, 406, 396, 420, 472, 548, 559, 463, 407, 362, 405,
        417, 391, 419, 461, 472, 535, 622, 606, 508, 461, 390, 432
	};

	int N = 144,i,j;
	int Nseas = 1;
	int f[1] = {12};
	int iterate = 2;
	double **seasonal,*trend,*remainder;
	int s_window = 13;
	double lambda;

	seasonal = (double**)calloc(Nseas,sizeof(double*));
	trend = (double*)calloc(N,sizeof(double));
	remainder = (double*)calloc(N,sizeof(double));

	for(i = 0; i < Nseas;++i) {
		seasonal[i] = (double*)calloc(N,sizeof(double));
	}

	mstl(x, N,f,&Nseas,&s_window,NULL,&iterate,seasonal,trend,remainder);

	for(i = 0; i < Nseas;++i) {
		printf("\n Seasonal%d :\n",f[i]);
		for(j = 0; j < N;++j) {
			printf("%g ",seasonal[i][j]);
		}
		printf("\n\n");
	}

	mdisplay(trend,1,N);
	mdisplay(remainder,1,N);
	free(seasonal);
	free(trend);
	free(remainder);
}